

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall cfd::js::api::json::DecodePsbtInput::DecodePsbtInput(DecodePsbtInput *this)

{
  allocator local_25 [20];
  allocator local_11;
  DecodePsbtInput *local_10;
  DecodePsbtInput *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::DecodePsbtInput>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::DecodePsbtInput>);
  (this->super_JsonClassBase<cfd::js::api::json::DecodePsbtInput>)._vptr_JsonClassBase =
       (_func_int **)&PTR__DecodePsbtInput_01b47990;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->non_witness_utxo_hex_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  DecodeRawTransactionResponse::DecodeRawTransactionResponse(&this->non_witness_utxo_);
  DecodePsbtUtxo::DecodePsbtUtxo(&this->witness_utxo_);
  core::
  JsonObjectVector<cfd::js::api::json::PsbtSignatureData,_cfd::js::api::PsbtSignatureDataStruct>::
  JsonObjectVector(&this->partial_signatures_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->sighash_,"",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  PsbtScriptData::PsbtScriptData(&this->redeem_script_);
  PsbtScriptData::PsbtScriptData(&this->witness_script_);
  core::JsonObjectVector<cfd::js::api::json::PsbtBip32Data,_cfd::js::api::PsbtBip32DataStruct>::
  JsonObjectVector(&this->bip32_derivs_);
  DecodeUnlockingScript::DecodeUnlockingScript(&this->final_scriptsig_);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::JsonValueVector(&this->final_scriptwitness_);
  core::JsonObjectVector<cfd::js::api::json::PsbtMapData,_cfd::js::api::PsbtMapDataStruct>::
  JsonObjectVector(&this->unknown_);
  CollectFieldName();
  return;
}

Assistant:

DecodePsbtInput() {
    CollectFieldName();
  }